

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::
pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
::resize(pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
         *this,size_type ns,left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *val)

{
  uint uVar1;
  left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *first;
  
  uVar1 = (this->ebo_).size;
  if (uVar1 < ns) {
    if ((this->ebo_).cap < ns) {
      append_realloc(this,ns - uVar1,val);
    }
    else {
      first = (this->ebo_).buf + uVar1;
      detail::fill<bk_lib::left_right_sequence<Clasp::ClauseWatch,Clasp::GenericWatch,0u>>
                (first,first + (ns - uVar1),val);
    }
  }
  (this->ebo_).size = ns;
  return;
}

Assistant:

void resize(size_type ns, const T& val = T()) {
		if (ns > size()) {
			ns <= capacity() ? detail::fill(end(), end()+(ns-size()), val) : append_realloc(ns-size(), val);
		}
		ebo_.size = ns;
	}